

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

void __thiscall
Diligent::VariableSizeAllocationsManager::Free
          (VariableSizeAllocationsManager *this,OffsetType Offset,OffsetType Size)

{
  unsigned_long uVar1;
  undefined8 uVar2;
  OffsetType OVar3;
  bool bVar4;
  bool bVar5;
  Char *pCVar6;
  ulong uVar7;
  pointer ppVar8;
  long lVar9;
  iterator Args_1;
  size_t sVar10;
  char (*pacVar11) [57];
  char (*Args_1_00) [57];
  VariableSizeAllocationsManager *in_RCX;
  VariableSizeAllocationsManager *Args_1_01;
  OffsetType OVar12;
  undefined1 local_1c0 [8];
  string msg_5;
  string msg_4;
  _Self local_160;
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  const_iterator local_130;
  const_iterator local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  _Self local_100;
  _Self local_f8;
  unsigned_long local_f0;
  OffsetType NewOffset;
  OffsetType NewSize;
  undefined1 local_d8 [8];
  string msg_3;
  _Self local_b0;
  iterator PrevBlockIt;
  string msg_2;
  undefined1 local_80 [8];
  string msg_1;
  iterator LowBnd;
  iterator NextBlockIt;
  undefined1 local_40 [8];
  string msg;
  OffsetType Size_local;
  OffsetType Offset_local;
  VariableSizeAllocationsManager *this_local;
  
  msg.field_2._8_8_ = Size;
  Size_local = Offset;
  Offset_local = (OffsetType)this;
  if ((Offset == 0xffffffffffffffff) ||
     (Args_1_01 = this, in_RCX = this, this->m_MaxSize < Offset + Size)) {
    FormatString<char[26],char[66]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize",
               (char (*) [66])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    Args_1_01 = (VariableSizeAllocationsManager *)0x118;
    DebugAssertionFailed
              (pCVar6,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x118);
    std::__cxx11::string::~string((string *)local_40);
  }
  LowBnd = std::
           map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
           ::upper_bound(&this->m_FreeBlocksByOffset,&Size_local);
  msg_1.field_2._8_8_ =
       std::
       map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
       ::lower_bound(&this->m_FreeBlocksByOffset,&Size_local);
  bVar4 = std::operator==((_Self *)((long)&msg_1.field_2 + 8),&LowBnd);
  if (!bVar4) {
    FormatString<char[26],char[22]>
              ((string *)local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LowBnd == NextBlockIt",(char (*) [22])Args_1_01);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    Args_1_01 = (VariableSizeAllocationsManager *)0x122;
    DebugAssertionFailed
              (pCVar6,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x122);
    std::__cxx11::string::~string((string *)local_80);
  }
  msg_2.field_2._8_8_ =
       std::
       map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
       ::end(&this->m_FreeBlocksByOffset);
  bVar5 = std::operator==(&LowBnd,(_Self *)((long)&msg_2.field_2 + 8));
  ppVar8 = (pointer)CONCAT71((int7)((ulong)Args_1_01 >> 8),bVar5);
  bVar4 = true;
  if (!bVar5) {
    uVar7 = Size_local + msg.field_2._8_8_;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&LowBnd);
    bVar4 = uVar7 <= ppVar8->first;
  }
  if (!bVar4) {
    FormatString<char[26],char[81]>
              ((string *)&PrevBlockIt,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first",
               (char (*) [81])ppVar8);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    ppVar8 = (pointer)0x126;
    DebugAssertionFailed
              (pCVar6,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x126);
    std::__cxx11::string::~string((string *)&PrevBlockIt);
  }
  local_b0._M_node = LowBnd._M_node;
  msg_3.field_2._8_8_ =
       std::
       map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
       ::begin(&this->m_FreeBlocksByOffset);
  bVar4 = std::operator!=(&local_b0,(_Self *)((long)&msg_3.field_2 + 8));
  if (bVar4) {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
    ::operator--(&local_b0);
    OVar3 = Size_local;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_b0);
    uVar1 = ppVar8->first;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_b0);
    ppVar8 = (pointer)(uVar1 + (ppVar8->second).Size);
    if (OVar3 < ppVar8) {
      FormatString<char[26],char[56]>
                ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Offset >= PrevBlockIt->first + PrevBlockIt->second.Size",
                 (char (*) [56])ppVar8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      ppVar8 = (pointer)0x12c;
      DebugAssertionFailed
                (pCVar6,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,300);
      std::__cxx11::string::~string((string *)local_d8);
    }
  }
  else {
    NewSize = (OffsetType)
              std::
              map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
              ::end(&this->m_FreeBlocksByOffset);
    local_b0._M_node = (_Base_ptr)NewSize;
  }
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
       ::end(&this->m_FreeBlocksByOffset);
  bVar5 = std::operator!=(&local_b0,&local_f8);
  OVar3 = Size_local;
  OVar12 = CONCAT71((int7)((ulong)ppVar8 >> 8),bVar5);
  bVar4 = false;
  if (bVar5) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_b0);
    uVar1 = ppVar8->first;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_b0);
    OVar12 = uVar1 + (ppVar8->second).Size;
    bVar4 = OVar3 == OVar12;
  }
  if (bVar4) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_b0);
    NewOffset = (ppVar8->second).Size + msg.field_2._8_8_;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_b0);
    local_f0 = ppVar8->first;
    local_100._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_FreeBlocksByOffset);
    bVar5 = std::operator!=(&LowBnd,&local_100);
    Args_1._M_node = (_Base_ptr)CONCAT71((int7)(OVar12 >> 8),bVar5);
    bVar4 = false;
    if (bVar5) {
      lVar9 = Size_local + msg.field_2._8_8_;
      Args_1._M_node =
           (_Base_ptr)
           std::
           _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
           ::operator->(&LowBnd);
      bVar4 = lVar9 == *(long *)Args_1._M_node;
    }
    if (bVar4) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&LowBnd);
      NewOffset = (ppVar8->second).Size + NewOffset;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&local_b0);
      local_108 = (ppVar8->second).OrderBySizeIt._M_node;
      Args_1 = std::
               multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
               ::erase_abi_cxx11_((multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                                   *)&this->m_FreeBlocksBySize,local_108);
      local_110 = Args_1._M_node;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&LowBnd);
      local_118 = (ppVar8->second).OrderBySizeIt._M_node;
      local_120 = (_Base_ptr)
                  std::
                  multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                  ::erase_abi_cxx11_((multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                                      *)&this->m_FreeBlocksBySize,(iterator)local_118);
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
      ::operator++(&LowBnd);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
      ::_Rb_tree_const_iterator(&local_128,&local_b0);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
      ::_Rb_tree_const_iterator(&local_130,&LowBnd);
      local_138 = (_Base_ptr)
                  std::
                  map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                  ::erase(&this->m_FreeBlocksByOffset,local_128,local_130);
    }
    else {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&local_b0);
      local_140 = (ppVar8->second).OrderBySizeIt._M_node;
      local_148 = (_Base_ptr)
                  std::
                  multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                  ::erase_abi_cxx11_((multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                                      *)&this->m_FreeBlocksBySize,(iterator)local_140);
      local_150 = local_b0._M_node;
      local_158 = (_Base_ptr)
                  std::
                  map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                  ::erase_abi_cxx11_((map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                                      *)this,local_b0._M_node);
    }
  }
  else {
    local_160._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_FreeBlocksByOffset);
    bVar5 = std::operator!=(&LowBnd,&local_160);
    Args_1._M_node = (_Base_ptr)CONCAT71((int7)(OVar12 >> 8),bVar5);
    bVar4 = false;
    if (bVar5) {
      lVar9 = Size_local + msg.field_2._8_8_;
      Args_1._M_node =
           (_Base_ptr)
           std::
           _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
           ::operator->(&LowBnd);
      bVar4 = lVar9 == *(long *)Args_1._M_node;
    }
    uVar2 = msg.field_2._8_8_;
    if (bVar4) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&LowBnd);
      NewOffset = uVar2 + (ppVar8->second).Size;
      local_f0 = Size_local;
      Args_1._M_node = (_Base_ptr)Size_local;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&LowBnd);
      std::
      multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
      ::erase_abi_cxx11_((multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                          *)&this->m_FreeBlocksBySize,(ppVar8->second).OrderBySizeIt._M_node);
      std::
      map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
      ::erase_abi_cxx11_((map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                          *)this,LowBnd);
    }
    else {
      NewOffset = msg.field_2._8_8_;
      local_f0 = Size_local;
    }
  }
  AddNewBlock(this,local_f0,NewOffset);
  this->m_FreeSize = msg.field_2._8_8_ + this->m_FreeSize;
  bVar4 = IsEmpty(this);
  if (bVar4) {
    sVar10 = GetNumFreeBlocks(this);
    if (sVar10 != 1) {
      FormatString<char[26],char[24]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GetNumFreeBlocks() == 1",(char (*) [24])Args_1._M_node);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x16d);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    ResetCurrAlignment(this);
  }
  pacVar11 = (char (*) [57])
             std::
             map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
             ::size(&this->m_FreeBlocksByOffset);
  Args_1_00 = (char (*) [57])
              std::
              multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
              ::size(&this->m_FreeBlocksBySize);
  if (pacVar11 != Args_1_00) {
    FormatString<char[26],char[57]>
              ((string *)local_1c0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",Args_1_00);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x172);
    std::__cxx11::string::~string((string *)local_1c0);
  }
  if ((this->m_DbgDisableDebugValidation & 1U) == 0) {
    DbgVerifyList(this);
  }
  return;
}

Assistant:

void Free(OffsetType Offset, OffsetType Size)
    {
        VERIFY_EXPR(Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize);

        // Find the first element whose offset is greater than the specified offset.
        // upper_bound() returns an iterator pointing to the first element in the
        // container whose key is considered to go after k.
        auto NextBlockIt = m_FreeBlocksByOffset.upper_bound(Offset);
#ifdef DILIGENT_DEBUG
        {
            auto LowBnd = m_FreeBlocksByOffset.lower_bound(Offset); // First element whose offset is  >=
            // Since zero-size allocations are not allowed, lower bound must always be equal to the upper bound
            VERIFY_EXPR(LowBnd == NextBlockIt);
        }
#endif
        // Block being deallocated must not overlap with the next block
        VERIFY_EXPR(NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first);
        auto PrevBlockIt = NextBlockIt;
        if (PrevBlockIt != m_FreeBlocksByOffset.begin())
        {
            --PrevBlockIt;
            // Block being deallocated must not overlap with the previous block
            VERIFY_EXPR(Offset >= PrevBlockIt->first + PrevBlockIt->second.Size);
        }
        else
            PrevBlockIt = m_FreeBlocksByOffset.end();

        OffsetType NewSize, NewOffset;
        if (PrevBlockIt != m_FreeBlocksByOffset.end() && Offset == PrevBlockIt->first + PrevBlockIt->second.Size)
        {
            //  PrevBlock.Offset             Offset
            //       |                          |
            //       |<-----PrevBlock.Size----->|<------Size-------->|
            //
            NewSize   = PrevBlockIt->second.Size + Size;
            NewOffset = PrevBlockIt->first;

            if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
            {
                //   PrevBlock.Offset           Offset            NextBlock.Offset
                //     |                          |                    |
                //     |<-----PrevBlock.Size----->|<------Size-------->|<-----NextBlock.Size----->|
                //
                NewSize += NextBlockIt->second.Size;
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
                // Delete the range of two blocks
                ++NextBlockIt;
                m_FreeBlocksByOffset.erase(PrevBlockIt, NextBlockIt);
            }
            else
            {
                //   PrevBlock.Offset           Offset                     NextBlock.Offset
                //     |                          |                             |
                //     |<-----PrevBlock.Size----->|<------Size-------->| ~ ~ ~  |<-----NextBlock.Size----->|
                //
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksByOffset.erase(PrevBlockIt);
            }
        }
        else if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
        {
            //   PrevBlock.Offset                   Offset            NextBlock.Offset
            //     |                                  |                    |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->|<-----NextBlock.Size----->|
            //
            NewSize   = Size + NextBlockIt->second.Size;
            NewOffset = Offset;
            m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
            m_FreeBlocksByOffset.erase(NextBlockIt);
        }
        else
        {
            //   PrevBlock.Offset                   Offset                     NextBlock.Offset
            //     |                                  |                            |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~ |<-----NextBlock.Size----->|
            //
            NewSize   = Size;
            NewOffset = Offset;
        }

        AddNewBlock(NewOffset, NewSize);

        m_FreeSize += Size;
        if (IsEmpty())
        {
            // Reset current alignment
            VERIFY_EXPR(GetNumFreeBlocks() == 1);
            ResetCurrAlignment();
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
    }